

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O2

int Mecab_initialize(Mecab *m)

{
  m->feature = (char **)0x0;
  m->size = 0;
  m->lattice = (void *)0x0;
  m->model = (void *)0x0;
  m->tagger = (void *)0x0;
  return 1;
}

Assistant:

BOOL Mecab_initialize(Mecab *m)
{
   m->feature = NULL;
   m->size = 0;
   m->model = NULL;
   m->tagger = NULL;
   m->lattice = NULL;
   return TRUE;
}